

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimfmtprops.cpp
# Opt level: O0

bool __thiscall
icu_63::number::impl::DecimalFormatProperties::_equals
          (DecimalFormatProperties *this,DecimalFormatProperties *other,bool ignoreForFastFormat)

{
  bool bVar1;
  UBool UVar2;
  CurrencyPluralInfo *pCVar3;
  CurrencyPluralInfo *pCVar4;
  bool bVar5;
  bool local_67;
  bool local_64;
  bool local_56;
  bool local_54;
  bool local_4f;
  bool local_41;
  bool local_31;
  bool eq;
  bool ignoreForFastFormat_local;
  DecimalFormatProperties *other_local;
  DecimalFormatProperties *this_local;
  
  bVar1 = NullableValue<UNumberCompactStyle>::operator==(&this->compactStyle,&other->compactStyle);
  local_31 = false;
  if (bVar1) {
    local_31 = NullableValue<icu_63::CurrencyUnit>::operator==(&this->currency,&other->currency);
  }
  bVar1 = false;
  if (local_31 != false) {
    pCVar3 = LocalPointerBase<icu_63::CurrencyPluralInfo>::getAlias
                       ((LocalPointerBase<icu_63::CurrencyPluralInfo> *)&this->currencyPluralInfo);
    pCVar4 = LocalPointerBase<icu_63::CurrencyPluralInfo>::getAlias
                       ((LocalPointerBase<icu_63::CurrencyPluralInfo> *)&other->currencyPluralInfo);
    bVar1 = pCVar3 == pCVar4;
  }
  local_41 = false;
  if (bVar1) {
    local_41 = NullableValue<UCurrencyUsage>::operator==(&this->currencyUsage,&other->currencyUsage)
    ;
  }
  bVar1 = false;
  if (local_41 != false) {
    bVar1 = (this->decimalSeparatorAlwaysShown & 1U) == (other->decimalSeparatorAlwaysShown & 1U);
  }
  bVar5 = false;
  if (bVar1) {
    bVar5 = (this->exponentSignAlwaysShown & 1U) == (other->exponentSignAlwaysShown & 1U);
  }
  bVar1 = false;
  if (bVar5) {
    bVar1 = (this->formatFailIfMoreThanMaxDigits & 1U) ==
            (other->formatFailIfMoreThanMaxDigits & 1U);
  }
  bVar5 = false;
  if (bVar1) {
    bVar5 = this->formatWidth == other->formatWidth;
  }
  bVar1 = false;
  if (bVar5) {
    bVar1 = this->magnitudeMultiplier == other->magnitudeMultiplier;
  }
  bVar5 = false;
  if (bVar1) {
    bVar5 = this->maximumSignificantDigits == other->maximumSignificantDigits;
  }
  bVar1 = false;
  if (bVar5) {
    bVar1 = this->minimumExponentDigits == other->minimumExponentDigits;
  }
  bVar5 = false;
  if (bVar1) {
    bVar5 = this->minimumGroupingDigits == other->minimumGroupingDigits;
  }
  bVar1 = false;
  if (bVar5) {
    bVar1 = this->minimumSignificantDigits == other->minimumSignificantDigits;
  }
  bVar5 = false;
  if (bVar1) {
    bVar5 = this->multiplier == other->multiplier;
  }
  bVar1 = false;
  if (bVar5) {
    bVar1 = this->multiplierScale == other->multiplierScale;
  }
  bVar5 = false;
  if (bVar1) {
    UVar2 = UnicodeString::operator==(&this->negativePrefix,&other->negativePrefix);
    bVar5 = UVar2 != '\0';
  }
  bVar1 = false;
  if (bVar5) {
    UVar2 = UnicodeString::operator==(&this->negativeSuffix,&other->negativeSuffix);
    bVar1 = UVar2 != '\0';
  }
  local_4f = false;
  if (bVar1) {
    local_4f = NullableValue<UNumberFormatPadPosition>::operator==
                         (&this->padPosition,&other->padPosition);
  }
  bVar1 = false;
  if (local_4f != false) {
    UVar2 = UnicodeString::operator==(&this->padString,&other->padString);
    bVar1 = UVar2 != '\0';
  }
  bVar5 = false;
  if (bVar1) {
    UVar2 = UnicodeString::operator==(&this->positivePrefix,&other->positivePrefix);
    bVar5 = UVar2 != '\0';
  }
  bVar1 = false;
  if (bVar5) {
    UVar2 = UnicodeString::operator==(&this->positiveSuffix,&other->positiveSuffix);
    bVar1 = UVar2 != '\0';
  }
  bVar5 = false;
  if (bVar1) {
    bVar5 = this->roundingIncrement == other->roundingIncrement;
  }
  local_54 = false;
  if (bVar5) {
    local_54 = NullableValue<UNumberFormatRoundingMode>::operator==
                         (&this->roundingMode,&other->roundingMode);
  }
  bVar1 = false;
  if (local_54 != false) {
    bVar1 = this->secondaryGroupingSize == other->secondaryGroupingSize;
  }
  local_56 = false;
  if (bVar1) {
    local_56 = (this->signAlwaysShown & 1U) == (other->signAlwaysShown & 1U);
  }
  if (ignoreForFastFormat) {
    this_local._7_1_ = local_56;
  }
  else {
    bVar1 = false;
    if (local_56 != false) {
      bVar1 = this->groupingSize == other->groupingSize;
    }
    bVar5 = false;
    if (bVar1) {
      bVar5 = (this->groupingUsed & 1U) == (other->groupingUsed & 1U);
    }
    bVar1 = false;
    if (bVar5) {
      bVar1 = this->minimumFractionDigits == other->minimumFractionDigits;
    }
    bVar5 = false;
    if (bVar1) {
      bVar5 = this->maximumFractionDigits == other->maximumFractionDigits;
    }
    bVar1 = false;
    if (bVar5) {
      bVar1 = this->maximumIntegerDigits == other->maximumIntegerDigits;
    }
    bVar5 = false;
    if (bVar1) {
      bVar5 = this->minimumIntegerDigits == other->minimumIntegerDigits;
    }
    bVar1 = false;
    if (bVar5) {
      UVar2 = UnicodeString::operator==(&this->negativePrefixPattern,&other->negativePrefixPattern);
      bVar1 = UVar2 != '\0';
    }
    bVar5 = false;
    if (bVar1) {
      UVar2 = UnicodeString::operator==(&this->negativeSuffixPattern,&other->negativeSuffixPattern);
      bVar5 = UVar2 != '\0';
    }
    bVar1 = false;
    if (bVar5) {
      UVar2 = UnicodeString::operator==(&this->positivePrefixPattern,&other->positivePrefixPattern);
      bVar1 = UVar2 != '\0';
    }
    bVar5 = false;
    if (bVar1) {
      UVar2 = UnicodeString::operator==(&this->positiveSuffixPattern,&other->positiveSuffixPattern);
      bVar5 = UVar2 != '\0';
    }
    bVar1 = false;
    if (bVar5) {
      bVar1 = (this->decimalPatternMatchRequired & 1U) == (other->decimalPatternMatchRequired & 1U);
    }
    bVar5 = false;
    if (bVar1) {
      bVar5 = (this->parseCaseSensitive & 1U) == (other->parseCaseSensitive & 1U);
    }
    bVar1 = false;
    if (bVar5) {
      bVar1 = (this->parseIntegerOnly & 1U) == (other->parseIntegerOnly & 1U);
    }
    local_64 = false;
    if (bVar1) {
      local_64 = NullableValue<icu_63::number::impl::ParseMode>::operator==
                           (&this->parseMode,&other->parseMode);
    }
    bVar1 = false;
    if (local_64 != false) {
      bVar1 = (this->parseNoExponent & 1U) == (other->parseNoExponent & 1U);
    }
    bVar5 = false;
    if (bVar1) {
      bVar5 = (this->parseToBigDecimal & 1U) == (other->parseToBigDecimal & 1U);
    }
    local_67 = false;
    if (bVar5) {
      local_67 = this->parseAllInput == other->parseAllInput;
    }
    this_local._7_1_ = local_67;
  }
  return this_local._7_1_;
}

Assistant:

bool
DecimalFormatProperties::_equals(const DecimalFormatProperties& other, bool ignoreForFastFormat) const {
    bool eq = true;

    // Properties that must be equal both normally and for fast-path formatting
    eq = eq && compactStyle == other.compactStyle;
    eq = eq && currency == other.currency;
    eq = eq && currencyPluralInfo.fPtr.getAlias() == other.currencyPluralInfo.fPtr.getAlias();
    eq = eq && currencyUsage == other.currencyUsage;
    eq = eq && decimalSeparatorAlwaysShown == other.decimalSeparatorAlwaysShown;
    eq = eq && exponentSignAlwaysShown == other.exponentSignAlwaysShown;
    eq = eq && formatFailIfMoreThanMaxDigits == other.formatFailIfMoreThanMaxDigits;
    eq = eq && formatWidth == other.formatWidth;
    eq = eq && magnitudeMultiplier == other.magnitudeMultiplier;
    eq = eq && maximumSignificantDigits == other.maximumSignificantDigits;
    eq = eq && minimumExponentDigits == other.minimumExponentDigits;
    eq = eq && minimumGroupingDigits == other.minimumGroupingDigits;
    eq = eq && minimumSignificantDigits == other.minimumSignificantDigits;
    eq = eq && multiplier == other.multiplier;
    eq = eq && multiplierScale == other.multiplierScale;
    eq = eq && negativePrefix == other.negativePrefix;
    eq = eq && negativeSuffix == other.negativeSuffix;
    eq = eq && padPosition == other.padPosition;
    eq = eq && padString == other.padString;
    eq = eq && positivePrefix == other.positivePrefix;
    eq = eq && positiveSuffix == other.positiveSuffix;
    eq = eq && roundingIncrement == other.roundingIncrement;
    eq = eq && roundingMode == other.roundingMode;
    eq = eq && secondaryGroupingSize == other.secondaryGroupingSize;
    eq = eq && signAlwaysShown == other.signAlwaysShown;

    if (ignoreForFastFormat) {
        return eq;
    }

    // Properties ignored by fast-path formatting
    // Formatting (special handling required):
    eq = eq && groupingSize == other.groupingSize;
    eq = eq && groupingUsed == other.groupingUsed;
    eq = eq && minimumFractionDigits == other.minimumFractionDigits;
    eq = eq && maximumFractionDigits == other.maximumFractionDigits;
    eq = eq && maximumIntegerDigits == other.maximumIntegerDigits;
    eq = eq && minimumIntegerDigits == other.minimumIntegerDigits;
    eq = eq && negativePrefixPattern == other.negativePrefixPattern;
    eq = eq && negativeSuffixPattern == other.negativeSuffixPattern;
    eq = eq && positivePrefixPattern == other.positivePrefixPattern;
    eq = eq && positiveSuffixPattern == other.positiveSuffixPattern;

    // Parsing (always safe to ignore):
    eq = eq && decimalPatternMatchRequired == other.decimalPatternMatchRequired;
    eq = eq && parseCaseSensitive == other.parseCaseSensitive;
    eq = eq && parseIntegerOnly == other.parseIntegerOnly;
    eq = eq && parseMode == other.parseMode;
    eq = eq && parseNoExponent == other.parseNoExponent;
    eq = eq && parseToBigDecimal == other.parseToBigDecimal;
    eq = eq && parseAllInput == other.parseAllInput;

    return eq;
}